

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

void uv__process_child_init
               (uv_process_options_t *options,int stdio_count,int (*pipes) [2],int error_fd)

{
  int iVar1;
  __sighandler_t p_Var2;
  int *piVar3;
  int local_b8;
  int _saved_errno;
  int n;
  int fd;
  int use_fd;
  int close_fd;
  sigset_t signewset;
  int error_fd_local;
  int (*pipes_local) [2];
  int stdio_count_local;
  uv_process_options_t *options_local;
  
  signewset.__val[0xf]._4_4_ = error_fd;
  for (local_b8 = 1; local_b8 < 0x20; local_b8 = local_b8 + 1) {
    if (((local_b8 != 9) && (local_b8 != 0x13)) &&
       (p_Var2 = signal(local_b8,(__sighandler_t)0x0), p_Var2 == (__sighandler_t)0xffffffffffffffff)
       ) {
      uv__write_errno(signewset.__val[0xf]._4_4_);
    }
  }
  if ((options->flags & 8) != 0) {
    setsid();
  }
  for (_saved_errno = 0; _saved_errno < stdio_count; _saved_errno = _saved_errno + 1) {
    iVar1 = pipes[_saved_errno][1];
    if ((-1 < iVar1) && (iVar1 < _saved_errno)) {
      iVar1 = fcntl64(iVar1,0x406,stdio_count);
      pipes[_saved_errno][1] = iVar1;
      if (pipes[_saved_errno][1] == -1) {
        uv__write_errno(signewset.__val[0xf]._4_4_);
      }
    }
  }
  _saved_errno = 0;
  do {
    if (stdio_count <= _saved_errno) {
      if ((options->cwd != (char *)0x0) && (iVar1 = chdir(options->cwd), iVar1 != 0)) {
        uv__write_errno(signewset.__val[0xf]._4_4_);
      }
      if ((options->flags & 3) != 0) {
        piVar3 = __errno_location();
        iVar1 = *piVar3;
        setgroups(0,(__gid_t *)0x0);
        piVar3 = __errno_location();
        *piVar3 = iVar1;
      }
      if (((options->flags & 2) != 0) && (iVar1 = setgid(options->gid), iVar1 != 0)) {
        uv__write_errno(signewset.__val[0xf]._4_4_);
      }
      if (((options->flags & 1) != 0) && (iVar1 = setuid(options->uid), iVar1 != 0)) {
        uv__write_errno(signewset.__val[0xf]._4_4_);
      }
      if (options->env != (char **)0x0) {
        _environ = options->env;
      }
      sigemptyset((sigset_t *)&use_fd);
      iVar1 = sigprocmask(2,(sigset_t *)&use_fd,(sigset_t *)0x0);
      if (iVar1 == 0) {
        execvp(options->file,options->args);
        uv__write_errno(signewset.__val[0xf]._4_4_);
        return;
      }
      abort();
    }
    fd = -1;
    n = pipes[_saved_errno][1];
    if (n < 0) {
      if (_saved_errno < 3) {
        uv__close_nocheckstdio(_saved_errno);
        iVar1 = 2;
        if (_saved_errno == 0) {
          iVar1 = 0;
        }
        n = open64("/dev/null",iVar1);
        fd = n;
        if (n < 0) {
          uv__write_errno(signewset.__val[0xf]._4_4_);
        }
        goto LAB_0011c6ec;
      }
    }
    else {
LAB_0011c6ec:
      if (_saved_errno == n) {
        if ((fd == -1) && (iVar1 = uv__cloexec(n,0), iVar1 != 0)) {
          uv__write_int(signewset.__val[0xf]._4_4_,iVar1);
        }
      }
      else {
        _saved_errno = dup2(n,_saved_errno);
      }
      if (_saved_errno == -1) {
        uv__write_errno(signewset.__val[0xf]._4_4_);
      }
      if ((_saved_errno < 3) && (fd == -1)) {
        uv__nonblock_fcntl(_saved_errno,0);
      }
      if (stdio_count <= fd) {
        uv__close(fd);
      }
    }
    _saved_errno = _saved_errno + 1;
  } while( true );
}

Assistant:

static void uv__process_child_init(const uv_process_options_t* options,
                                   int stdio_count,
                                   int (*pipes)[2],
                                   int error_fd) {
  sigset_t signewset;
  int close_fd;
  int use_fd;
  int fd;
  int n;

  /* Reset signal disposition first. Use a hard-coded limit because NSIG is not
   * fixed on Linux: it's either 32, 34 or 64, depending on whether RT signals
   * are enabled. We are not allowed to touch RT signal handlers, glibc uses
   * them internally.
   */
  for (n = 1; n < 32; n += 1) {
    if (n == SIGKILL || n == SIGSTOP)
      continue;  /* Can't be changed. */

#if defined(__HAIKU__)
    if (n == SIGKILLTHR)
      continue;  /* Can't be changed. */
#endif

    if (SIG_ERR != signal(n, SIG_DFL))
      continue;

    uv__write_errno(error_fd);
  }

  if (options->flags & UV_PROCESS_DETACHED)
    setsid();

  /* First duplicate low numbered fds, since it's not safe to duplicate them,
   * they could get replaced. Example: swapping stdout and stderr; without
   * this fd 2 (stderr) would be duplicated into fd 1, thus making both
   * stdout and stderr go to the same fd, which was not the intention. */
  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];
    if (use_fd < 0 || use_fd >= fd)
      continue;
#ifdef F_DUPFD_CLOEXEC /* POSIX 2008 */
    pipes[fd][1] = fcntl(use_fd, F_DUPFD_CLOEXEC, stdio_count);
#else
    pipes[fd][1] = fcntl(use_fd, F_DUPFD, stdio_count);
#endif
    if (pipes[fd][1] == -1)
      uv__write_errno(error_fd);
#ifndef F_DUPFD_CLOEXEC /* POSIX 2008 */
    n = uv__cloexec(pipes[fd][1], 1);
    if (n)
      uv__write_int(error_fd, n);
#endif
  }

  for (fd = 0; fd < stdio_count; fd++) {
    close_fd = -1;
    use_fd = pipes[fd][1];

    if (use_fd < 0) {
      if (fd >= 3)
        continue;
      else {
        /* Redirect stdin, stdout and stderr to /dev/null even if UV_IGNORE is
         * set. */
        uv__close_nocheckstdio(fd); /* Free up fd, if it happens to be open. */
        use_fd = open("/dev/null", fd == 0 ? O_RDONLY : O_RDWR);
        close_fd = use_fd;

        if (use_fd < 0)
          uv__write_errno(error_fd);
      }
    }

    if (fd == use_fd) {
      if (close_fd == -1) {
        n = uv__cloexec(use_fd, 0);
        if (n)
          uv__write_int(error_fd, n);
      }
    }
    else {
      fd = dup2(use_fd, fd);
    }

    if (fd == -1)
      uv__write_errno(error_fd);

    if (fd <= 2 && close_fd == -1)
      uv__nonblock_fcntl(fd, 0);

    if (close_fd >= stdio_count)
      uv__close(close_fd);
  }

  if (options->cwd != NULL && chdir(options->cwd))
    uv__write_errno(error_fd);

  if (options->flags & (UV_PROCESS_SETUID | UV_PROCESS_SETGID)) {
    /* When dropping privileges from root, the `setgroups` call will
     * remove any extraneous groups. If we don't call this, then
     * even though our uid has dropped, we may still have groups
     * that enable us to do super-user things. This will fail if we
     * aren't root, so don't bother checking the return value, this
     * is just done as an optimistic privilege dropping function.
     */
    SAVE_ERRNO(setgroups(0, NULL));
  }

  if ((options->flags & UV_PROCESS_SETGID) && setgid(options->gid))
    uv__write_errno(error_fd);

  if ((options->flags & UV_PROCESS_SETUID) && setuid(options->uid))
    uv__write_errno(error_fd);

  if (options->env != NULL)
    environ = options->env;

  /* Reset signal mask just before exec. */
  sigemptyset(&signewset);
  if (sigprocmask(SIG_SETMASK, &signewset, NULL) != 0)
    abort();

#ifdef __MVS__
  execvpe(options->file, options->args, environ);
#else
  execvp(options->file, options->args);
#endif

  uv__write_errno(error_fd);
}